

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O0

void __thiscall
robin_hood::detail::
Table<true,_80UL,_Rml::Character,_Rml::FontGlyph,_robin_hood::hash<Rml::Character,_void>,_std::equal_to<Rml::Character>_>
::Iter<true>::fastForward(Iter<true> *this)

{
  ulong uVar1;
  int local_2c;
  int inc;
  size_t n;
  Iter<true> *this_local;
  
  while (uVar1 = unaligned_load<unsigned_long>(this->mInfo), uVar1 == 0) {
    this->mInfo = this->mInfo + 8;
    this->mKeyVals = this->mKeyVals + 8;
  }
  if (uVar1 == 0) {
    local_2c = 0x40;
  }
  else {
    local_2c = 0;
    for (; (uVar1 & 1) == 0; uVar1 = uVar1 >> 1 | 0x8000000000000000) {
      local_2c = local_2c + 1;
    }
  }
  this->mInfo = this->mInfo + local_2c / 8;
  this->mKeyVals = this->mKeyVals + local_2c / 8;
  return;
}

Assistant:

void fastForward() noexcept {
            size_t n = 0;
            while (0U == (n = detail::unaligned_load<size_t>(mInfo))) {
                mInfo += sizeof(size_t);
                mKeyVals += sizeof(size_t);
            }
#if defined(ROBIN_HOOD_DISABLE_INTRINSICS)
            // we know for certain that within the next 8 bytes we'll find a non-zero one.
            if (ROBIN_HOOD_UNLIKELY(0U == detail::unaligned_load<uint32_t>(mInfo))) {
                mInfo += 4;
                mKeyVals += 4;
            }
            if (ROBIN_HOOD_UNLIKELY(0U == detail::unaligned_load<uint16_t>(mInfo))) {
                mInfo += 2;
                mKeyVals += 2;
            }
            if (ROBIN_HOOD_UNLIKELY(0U == *mInfo)) {
                mInfo += 1;
                mKeyVals += 1;
            }
#else
#    if ROBIN_HOOD(LITTLE_ENDIAN)
            auto inc = ROBIN_HOOD_COUNT_TRAILING_ZEROES(n) / 8;
#    else
            auto inc = ROBIN_HOOD_COUNT_LEADING_ZEROES(n) / 8;
#    endif
            mInfo += inc;
            mKeyVals += inc;
#endif
        }